

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)21>_> *
vkt::anon_unknown_0::createDescriptorPool
          (Move<vk::Handle<(vk::HandleType)21>_> *__return_storage_ptr__,Context *context)

{
  DescriptorPoolBuilder *this;
  DeviceInterface *vk;
  VkDevice device;
  DescriptorPoolBuilder local_30;
  Context *local_18;
  Context *context_local;
  
  local_18 = context;
  context_local = (Context *)__return_storage_ptr__;
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(&local_30);
  this = ::vk::DescriptorPoolBuilder::addType(&local_30,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,2);
  vk = Context::getDeviceInterface(local_18);
  device = Context::getDevice(local_18);
  ::vk::DescriptorPoolBuilder::build(__return_storage_ptr__,this,vk,device,1,1);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder(&local_30);
  return __return_storage_ptr__;
}

Assistant:

Move<vk::VkDescriptorPool> createDescriptorPool (Context& context)
{
	return vk::DescriptorPoolBuilder()
				.addType(vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, 2u)
				.build(context.getDeviceInterface(), context.getDevice(), vk::VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);
}